

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm_all.cc
# Opt level: O0

void __thiscall
cnn::TreeLSTMAllBuilder::start_new_sequence_impl
          (TreeLSTMAllBuilder *this,
          vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *hinit)

{
  int iVar1;
  size_type sVar2;
  const_reference pvVar3;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_RSI;
  long in_RDI;
  uint i;
  const_reference in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar4;
  
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
           *)0x6d58f4);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
           *)0x6d5905);
  sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(in_RSI);
  if (sVar2 == 0) {
    *(undefined1 *)(in_RDI + 0x130) = 0;
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x168);
    sVar2 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::size(in_RSI)
    ;
    if ((uint)(iVar1 << 1) != sVar2) {
      __assert_fail("layers*2 == hinit.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/treelstm_all.cc"
                    ,0x7c,
                    "virtual void cnn::TreeLSTMAllBuilder::start_new_sequence_impl(const vector<Expression> &)"
                   );
    }
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::resize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    for (uVar4 = 0; uVar4 < *(uint *)(in_RDI + 0x168); uVar4 = uVar4 + 1) {
      pvVar3 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::
               operator[](in_RSI,(ulong)uVar4);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 (in_RDI + 0x150),(ulong)uVar4);
      expr::Expression::operator=(in_stack_ffffffffffffffd0,pvVar3);
      in_stack_ffffffffffffffd0 =
           std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                     (in_RSI,(ulong)(uVar4 + *(int *)(in_RDI + 0x168)));
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 (in_RDI + 0x138),(ulong)uVar4);
      expr::Expression::operator=(in_stack_ffffffffffffffd0,pvVar3);
    }
    *(undefined1 *)(in_RDI + 0x130) = 1;
  }
  return;
}

Assistant:

void TreeLSTMAllBuilder::start_new_sequence_impl(const vector<Expression>& hinit) {
  h.clear();
  c.clear();
  if (hinit.size() > 0) {
    assert(layers*2 == hinit.size());
    h0.resize(layers);
    c0.resize(layers);
    for (unsigned i = 0; i < layers; ++i) {
      c0[i] = hinit[i];
      h0[i] = hinit[i + layers];
    }
    has_initial_state = true;
  } else {
    has_initial_state = false;
  }
}